

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

int buffer_open(buffer_t *buffer,char *path)

{
  int __fd;
  int iVar1;
  uint8_t *puVar2;
  char *pcVar3;
  GHashTable *pGVar4;
  stat status;
  stat local_b0;
  
  memset(&local_b0,0,0x90);
  __fd = open(path,0);
  if (__fd < 0) {
    perror("open");
  }
  else {
    buffer->f = __fd;
    iVar1 = fstat(__fd,&local_b0);
    if (iVar1 < 0) {
      pcVar3 = "fstat";
    }
    else {
      buffer->size = local_b0.st_size;
      puVar2 = (uint8_t *)mmap((void *)0x0,local_b0.st_size,1,2,__fd,0);
      if (puVar2 != (uint8_t *)0xffffffffffffffff) {
        buffer->data = puVar2;
        pcVar3 = strdup(path);
        buffer->path = pcVar3;
        *(undefined4 *)&buffer->start_mark = 0xffffffff;
        *(undefined4 *)((long)&buffer->start_mark + 4) = 0xffffffff;
        *(undefined4 *)&buffer->end_mark = 0xffffffff;
        *(undefined4 *)((long)&buffer->end_mark + 4) = 0xffffffff;
        buffer->cursor = 0;
        pGVar4 = (GHashTable *)g_hash_table_new_full(0,0,0,g_free);
        buffer->comments = pGVar4;
        buffer->highlights = (GSList *)0x0;
        buffer->bookmarks_head = -1;
        buffer->editable = 0;
        return 0;
      }
      pcVar3 = "mmap";
    }
    perror(pcVar3);
    if (__fd != 0) {
      close(__fd);
    }
  }
  return 1;
}

Assistant:

int
buffer_open(buffer_t *buffer, const char *path)
{
    int f = 0;
    struct stat status = {};
    uint8_t *data = NULL;

    f = open(path, O_RDONLY);
    if (f < 0) {
        perror("open");
        goto error;
    }

    buffer->f = f;

    if (fstat(f, &status) < 0) {
        perror("fstat");
        goto error;
    }

    buffer->size = status.st_size;

    data = mmap(NULL, status.st_size, PROT_READ, MAP_PRIVATE, f, 0);
    if (data == MAP_FAILED) {
        perror("mmap");
        goto error;
    }

    buffer->data = data;
    buffer->path = strdup(path);
    buffer->start_mark = -1;
    buffer->end_mark = -1;
    buffer->cursor = 0;
    buffer->comments = g_hash_table_new_full(NULL, NULL, NULL, g_free);
    buffer->highlights = NULL;
    buffer->bookmarks_head = -1;
    buffer->editable = 0;
    return 0;
error:
    if (f > 0) {
        close(f);
    }

    return 1;
}